

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O2

bool IntToBoundedCast(Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  int32_t *dataptr;
  void *pvVar9;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  idx_t extraout_RDX_01;
  idx_t extraout_RDX_02;
  idx_t extraout_RDX_03;
  idx_t idx;
  idx_t extraout_RDX_04;
  idx_t extraout_RDX_05;
  idx_t i;
  idx_t iVar10;
  ulong uVar11;
  VectorType VVar12;
  TemplatedValidityMask<unsigned_long> *other;
  ulong uVar13;
  idx_t i_1;
  idx_t iVar14;
  long lVar15;
  int32_t *local_b8;
  long local_b0;
  TemplatedValidityMask<unsigned_long> *local_a8;
  void *local_a0;
  void *local_98;
  long local_90;
  long local_88;
  int32_t output_max_val;
  long *local_78;
  long local_70;
  long local_68;
  
  output_max_val = BoundedType::GetMaxValue((LogicalType *)(result + 8));
  dataptr = &output_max_val;
  VVar12 = (VectorType)result;
  local_b8 = dataptr;
  if (*source == (Vector)0x0) {
    duckdb::Vector::SetVectorType(VVar12);
    lVar15 = *(long *)(result + 0x20);
    lVar4 = *(long *)(source + 0x20);
    duckdb::FlatVector::VerifyFlatVector(source);
    duckdb::FlatVector::VerifyFlatVector(result);
    if (*(long *)(source + 0x28) == 0) {
      iVar14 = extraout_RDX;
      for (iVar10 = 0; count != iVar10; iVar10 = iVar10 + 1) {
        iVar1 = *(int *)(lVar4 + iVar10 * 4);
        duckdb::UnaryLambdaWrapper::
        Operation<IntToBoundedCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                  (iVar1,(ValidityMask *)&local_b8,iVar14,dataptr);
        *(int *)(lVar15 + iVar10 * 4) = iVar1;
        iVar14 = extraout_RDX_04;
      }
    }
    else {
      other = (TemplatedValidityMask<unsigned_long> *)(source + 0x28);
      duckdb::TemplatedValidityMask<unsigned_long>::Initialize
                ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),other);
      local_a0 = (void *)(count + 0x3f >> 6);
      pvVar9 = (void *)0x0;
      iVar14 = extraout_RDX_00;
      uVar11 = 0;
      local_b0 = lVar15;
      local_a8 = other;
      while (pvVar9 != local_a0) {
        local_98 = pvVar9;
        if (*(long *)other == 0) {
          uVar8 = uVar11 + 0x40;
          if (count <= uVar11 + 0x40) {
            uVar8 = count;
          }
LAB_0011c635:
          for (; uVar6 = uVar11, uVar11 < uVar8; uVar11 = uVar11 + 1) {
            iVar1 = *(int *)(lVar4 + uVar11 * 4);
            duckdb::UnaryLambdaWrapper::
            Operation<IntToBoundedCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                      (iVar1,(ValidityMask *)&local_b8,iVar14,pvVar9);
            *(int *)(lVar15 + uVar11 * 4) = iVar1;
            iVar14 = extraout_RDX_01;
          }
        }
        else {
          uVar5 = *(ulong *)(*(long *)other + (long)pvVar9 * 8);
          uVar8 = uVar11 + 0x40;
          if (count <= uVar11 + 0x40) {
            uVar8 = count;
          }
          lVar15 = local_b0;
          if (uVar5 == 0xffffffffffffffff) goto LAB_0011c635;
          uVar6 = uVar8;
          if (uVar5 != 0) {
            local_88 = local_b0 + uVar11 * 4;
            local_90 = uVar11 * 4 + lVar4;
            for (uVar13 = 0; uVar6 = uVar11 + uVar13, other = local_a8, lVar15 = local_b0,
                uVar11 + uVar13 < uVar8; uVar13 = uVar13 + 1) {
              if ((uVar5 >> (uVar13 & 0x3f) & 1) != 0) {
                iVar1 = *(int *)(local_90 + uVar13 * 4);
                duckdb::UnaryLambdaWrapper::
                Operation<IntToBoundedCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                          (iVar1,(ValidityMask *)&local_b8,iVar14,pvVar9);
                *(int *)(local_88 + uVar13 * 4) = iVar1;
                iVar14 = extraout_RDX_02;
              }
            }
          }
        }
        uVar11 = uVar6;
        pvVar9 = (void *)((long)local_98 + 1);
      }
    }
  }
  else if (*source == (Vector)0x2) {
    duckdb::Vector::SetVectorType(VVar12);
    piVar2 = *(int **)(result + 0x20);
    piVar3 = *(int **)(source + 0x20);
    if ((*(byte **)(source + 0x28) == (byte *)0x0) || ((**(byte **)(source + 0x28) & 1) != 0)) {
      duckdb::ConstantVector::SetNull(result,false);
      iVar1 = *piVar3;
      duckdb::UnaryLambdaWrapper::
      Operation<IntToBoundedCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                (iVar1,(ValidityMask *)&local_b8,idx,dataptr);
      *piVar2 = iVar1;
    }
    else {
      duckdb::ConstantVector::SetNull(result,true);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)source,(UnifiedVectorFormat *)count);
    duckdb::Vector::SetVectorType(VVar12);
    lVar15 = *(long *)(result + 0x20);
    duckdb::FlatVector::VerifyFlatVector(result);
    if (local_68 == 0) {
      iVar14 = extraout_RDX_03;
      for (uVar11 = 0; count != uVar11; uVar11 = uVar11 + 1) {
        pvVar9 = (void *)*local_78;
        uVar8 = uVar11;
        if (pvVar9 != (void *)0x0) {
          uVar8 = (ulong)*(uint *)((long)pvVar9 + uVar11 * 4);
        }
        iVar1 = *(int *)(local_70 + uVar8 * 4);
        duckdb::UnaryLambdaWrapper::
        Operation<IntToBoundedCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                  (iVar1,(ValidityMask *)&local_b8,iVar14,pvVar9);
        *(int *)(lVar15 + uVar11 * 4) = iVar1;
        iVar14 = extraout_RDX_05;
      }
    }
    else {
      for (iVar14 = 0; count != iVar14; iVar14 = iVar14 + 1) {
        iVar7 = iVar14;
        if (*local_78 != 0) {
          iVar7 = (idx_t)*(uint *)(*local_78 + iVar14 * 4);
        }
        pvVar9 = *(void **)(local_68 + (iVar7 >> 6) * 8);
        if (((ulong)pvVar9 >> (iVar7 & 0x3f) & 1) == 0) {
          duckdb::TemplatedValidityMask<unsigned_long>::SetInvalid
                    ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),iVar14);
        }
        else {
          iVar1 = *(int *)(local_70 + iVar7 * 4);
          duckdb::UnaryLambdaWrapper::
          Operation<IntToBoundedCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                    (iVar1,(ValidityMask *)&local_b8,iVar7 >> 6,pvVar9);
          *(int *)(lVar15 + iVar14 * 4) = iVar1;
        }
      }
    }
    duckdb::UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  }
  return true;
}

Assistant:

static bool IntToBoundedCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto &ty = result.GetType();
	auto output_max_val = BoundedType::GetMaxValue(ty);
	UnaryExecutor::Execute<int32_t, int32_t>(source, result, count, [&](int32_t input) {
		if (input > output_max_val) {
			throw ConversionException(StringUtil::Format("Value %s exceeds max value of bounded type (%s)",
			                                             to_string(input), to_string(output_max_val)));
		}
		return input;
	});
	return true;
}